

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

char16 * __thiscall Js::ConcatStringBuilder::GetSz(ConcatStringBuilder *this)

{
  char16 *pcVar1;
  ConcatStringBuilder *pCVar2;
  
  pcVar1 = ConcatStringBase::GetSzImpl<Js::ConcatStringBuilder>(&this->super_ConcatStringBase);
  for (pCVar2 = this; pCVar2 != (ConcatStringBuilder *)0x0; pCVar2 = (pCVar2->m_prevChunk).ptr) {
    memset((pCVar2->m_slots).ptr,0,(long)pCVar2->m_count << 3);
  }
  LiteralStringWithPropertyStringPtr::ConvertString<Js::ConcatStringBuilder>(this);
  return pcVar1;
}

Assistant:

const char16 * ConcatStringBuilder::GetSz()
    {
        const char16 * sz = GetSzImpl<ConcatStringBuilder>();

        // Allow a/b to be garbage collected if no more refs.
        ConcatStringBuilder* current = this;
        while (current != NULL)
        {
            ClearArray(current->m_slots, current->m_count);
            current = current->m_prevChunk;
        }

        LiteralStringWithPropertyStringPtr::ConvertString(this);
        return sz;
    }